

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_umax_i32_mips64(TCGContext_conflict5 *tcg_ctx,TCGv_i32 ret,TCGv_i32 a,TCGv_i32 b)

{
  TCGOp *pTVar1;
  uintptr_t o_2;
  uintptr_t o_1;
  uintptr_t o;
  
  pTVar1 = tcg_emit_op_mips64(tcg_ctx,INDEX_op_movcond_i32);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(a + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)(b + (long)tcg_ctx);
  pTVar1->args[3] = (TCGArg)(b + (long)tcg_ctx);
  pTVar1->args[4] = (TCGArg)(a + (long)tcg_ctx);
  pTVar1->args[5] = 4;
  return;
}

Assistant:

void tcg_gen_umax_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 a, TCGv_i32 b)
{
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LTU, ret, a, b, b, a);
}